

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall cmCTestRunTest::CheckOutput(cmCTestRunTest *this)

{
  string *psVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  pointer this_00;
  double dVar6;
  double dVar7;
  char *local_1e8 [4];
  string line;
  ostringstream cmCTestLog_msg;
  
  dVar6 = cmsys::SystemTools::GetTime();
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  psVar1 = &this->ProcessOutput;
LAB_003486a5:
  do {
    dVar7 = cmsys::SystemTools::GetTime();
    dVar7 = (dVar6 + 0.1) - dVar7;
    bVar3 = true;
    if (dVar7 <= 0.0) {
LAB_00348871:
      std::__cxx11::string::~string((string *)&line);
      return bVar3;
    }
    iVar4 = cmProcess::GetNextOutputLine(this->TestProcess,&line,dVar7);
    if (iVar4 != 2) {
      if (iVar4 == 0) {
        bVar3 = false;
      }
      goto LAB_00348871;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(poVar5,(string *)&line);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x3e,local_1e8[0],false);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    this_00 = (this->TestProperties->TimeoutRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (this_00 !=
        (this->TestProperties->TimeoutRegularExpressions).
        super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (this_00 ==
            (this->TestProperties->TimeoutRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003486a5;
        bVar3 = cmsys::RegularExpression::find(&this_00->first,(psVar1->_M_dataplus)._M_p);
        this_00 = this_00 + 1;
      } while (!bVar3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
      poVar5 = std::operator<<(poVar5,": ");
      std::operator<<(poVar5,"Test timeout changed to ");
      poVar5 = std::ostream::_M_insert<double>(this->TestProperties->AlternateTimeout);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x4e,local_1e8[0],false);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      cmProcess::ResetStartTime(this->TestProcess);
      cmProcess::ChangeTimeout(this->TestProcess,this->TestProperties->AlternateTimeout);
      std::
      vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&this->TestProperties->TimeoutRegularExpressions);
    }
  } while( true );
}

Assistant:

bool cmCTestRunTest::CheckOutput()
{
  // Read lines for up to 0.1 seconds of total time.
  double timeout = 0.1;
  double timeEnd = cmSystemTools::GetTime() + timeout;
  std::string line;
  while ((timeout = timeEnd - cmSystemTools::GetTime(), timeout > 0)) {
    int p = this->TestProcess->GetNextOutputLine(line, timeout);
    if (p == cmsysProcess_Pipe_None) {
      // Process has terminated and all output read.
      return false;
    }
    if (p == cmsysProcess_Pipe_STDOUT) {
      // Store this line of output.
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->GetIndex()
                   << ": " << line << std::endl);
      this->ProcessOutput += line;
      this->ProcessOutput += "\n";

      // Check for TIMEOUT_AFTER_MATCH property.
      if (!this->TestProperties->TimeoutRegularExpressions.empty()) {
        std::vector<
          std::pair<cmsys::RegularExpression, std::string> >::iterator regIt;
        for (regIt = this->TestProperties->TimeoutRegularExpressions.begin();
             regIt != this->TestProperties->TimeoutRegularExpressions.end();
             ++regIt) {
          if (regIt->first.find(this->ProcessOutput.c_str())) {
            cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->GetIndex()
                         << ": "
                         << "Test timeout changed to "
                         << this->TestProperties->AlternateTimeout
                         << std::endl);
            this->TestProcess->ResetStartTime();
            this->TestProcess->ChangeTimeout(
              this->TestProperties->AlternateTimeout);
            this->TestProperties->TimeoutRegularExpressions.clear();
            break;
          }
        }
      }
    } else { // if(p == cmsysProcess_Pipe_Timeout)
      break;
    }
  }
  return true;
}